

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

void http_write_log(http_s *h)

{
  long lVar1;
  long lVar2;
  FIOBJ dest;
  uint64_t key_hash;
  FIOBJ FVar3;
  intptr_t num;
  fio_str_info_s local_90;
  FIOBJ local_78;
  FIOBJ date;
  fio_str_info_s buff;
  fio_str_info_s peer;
  timespec end;
  timespec start;
  intptr_t bytes_sent;
  FIOBJ l;
  http_s *h_local;
  
  dest = fiobj_str_buf(0x80);
  FVar3 = (h->private_data).out_headers;
  key_hash = fiobj_obj2hash(HTTP_HEADER_CONTENT_LENGTH);
  FVar3 = fiobj_hash_get2(FVar3,key_hash);
  num = fiobj_obj2num(FVar3);
  clock_gettime(0,(timespec *)&peer.data);
  lVar1 = (h->received_at).tv_sec;
  lVar2 = (h->received_at).tv_nsec;
  fio_peer_addr((fio_str_info_s *)&buff.data,*(intptr_t *)((h->private_data).flag + 0x30));
  fiobj_str_write(dest,(char *)peer.len,peer.capa);
  fiobj_obj2cstr((fio_str_info_s *)&date,dest);
  if (buff.capa == 0) {
    *(undefined8 *)buff.len = 0x6e776f6e6b6e755b;
    *(undefined1 *)(buff.len + 8) = 0x5d;
    buff.capa = 9;
  }
  *(undefined4 *)(buff.len + buff.capa) = 0x2d202d20;
  *(undefined2 *)(buff.len + 4 + buff.capa) = 0x5b20;
  buff.capa = buff.capa + 6;
  fiobj_str_resize(dest,buff.capa);
  fio_lock(&date_lock);
  local_78 = fiobj_dup(current_date);
  fio_unlock(&date_lock);
  fiobj_str_concat(dest,current_date);
  fiobj_free(local_78);
  fiobj_str_write(dest,"] \"",3);
  fiobj_str_concat(dest,h->method);
  fiobj_str_write(dest," ",1);
  fiobj_str_concat(dest,h->path);
  fiobj_str_write(dest," ",1);
  fiobj_str_concat(dest,h->version);
  fiobj_str_write(dest,"\" ",2);
  if (num < 1) {
    FVar3 = fiobj_num_tmp(h->status);
    fiobj_str_concat(dest,FVar3);
    fiobj_str_write(dest," -- ",4);
  }
  else {
    fiobj_str_write_i(dest,h->status);
    fiobj_str_write(dest," ",1);
    fiobj_str_write_i(dest,num);
    fiobj_str_write(dest,"b ",2);
  }
  fiobj_str_write_i(dest,((long)peer.data - lVar1) * 1000 + (end.tv_sec - lVar2) / 1000000);
  fiobj_str_write(dest,"ms\r\n",4);
  fiobj_obj2cstr(&local_90,dest);
  date = local_90.capa;
  buff.capa = local_90.len;
  buff.len = (size_t)local_90.data;
  fwrite(local_90.data,1,local_90.len,_stderr);
  fiobj_free(dest);
  return;
}

Assistant:

void http_write_log(http_s *h) {
  FIOBJ l = fiobj_str_buf(128);

  intptr_t bytes_sent = fiobj_obj2num(fiobj_hash_get2(
      h->private_data.out_headers, fiobj_obj2hash(HTTP_HEADER_CONTENT_LENGTH)));

  struct timespec start, end;
  clock_gettime(CLOCK_REALTIME, &end);
  start = h->received_at;

  {
    // TODO Guess IP address from headers (forwarded) where possible
    fio_str_info_s peer = fio_peer_addr(http2protocol(h)->uuid);
    fiobj_str_write(l, peer.data, peer.len);
  }
  fio_str_info_s buff = fiobj_obj2cstr(l);

  if (buff.len == 0) {
    memcpy(buff.data, "[unknown]", 9);
    buff.len = 9;
  }
  memcpy(buff.data + buff.len, " - - [", 6);
  buff.len += 6;
  fiobj_str_resize(l, buff.len);
  {
    FIOBJ date;
    fio_lock(&date_lock);
    date = fiobj_dup(current_date);
    fio_unlock(&date_lock);
    fiobj_str_join(l, current_date);
    fiobj_free(date);
  }
  fiobj_str_write(l, "] \"", 3);
  fiobj_str_join(l, h->method);
  fiobj_str_write(l, " ", 1);
  fiobj_str_join(l, h->path);
  fiobj_str_write(l, " ", 1);
  fiobj_str_join(l, h->version);
  fiobj_str_write(l, "\" ", 2);
  if (bytes_sent > 0) {
    fiobj_str_write_i(l, h->status);
    fiobj_str_write(l, " ", 1);
    fiobj_str_write_i(l, bytes_sent);
    fiobj_str_write(l, "b ", 2);
  } else {
    fiobj_str_join(l, fiobj_num_tmp(h->status));
    fiobj_str_write(l, " -- ", 4);
  }

  bytes_sent = ((end.tv_sec - start.tv_sec) * 1000) +
               ((end.tv_nsec - start.tv_nsec) / 1000000);
  fiobj_str_write_i(l, bytes_sent);
  fiobj_str_write(l, "ms\r\n", 4);

  buff = fiobj_obj2cstr(l);
  fwrite(buff.data, 1, buff.len, stderr);
  fiobj_free(l);
}